

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall
rpc_tests::rpc_getblockstats_calculate_percentiles_by_weight::test_method
          (rpc_getblockstats_calculate_percentiles_by_weight *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  CAmount *pCVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  char *local_440;
  char *local_438;
  undefined **local_430;
  undefined1 local_428;
  undefined1 *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  int local_3ec;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> feerates;
  CAmount result4 [5];
  CAmount result3 [5];
  CAmount result2 [5];
  CAmount result [5];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result[2] = 0;
  result[3] = 0;
  result[0] = 0;
  result[1] = 0;
  result[4] = 0;
  lVar4 = 100;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    result2[0] = CONCAT44(result2[0]._4_4_,1);
    result3[0] = CONCAT44(result3[0]._4_4_,1);
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
               (int *)result2,(int *)result3);
  }
  lVar4 = 100;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    result2[0] = CONCAT44(result2[0]._4_4_,2);
    result3[0] = CONCAT44(result3[0]._4_4_,1);
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
               (int *)result2,(int *)result3);
  }
  CalculatePercentilesByWeight(result,&feerates,200);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1ba;
  file.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result2[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_140 = "";
  result3[0] = CONCAT44(result3[0]._4_4_,1);
  pvVar2 = (iterator)0x2;
  pCVar3 = result;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result2,&local_148,0x1ba,1,2,pCVar3,"result[0]",result3,"1");
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x1bb;
  file_00.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result2[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_170 = "";
  pCVar3 = result + 1;
  result3[0] = CONCAT44(result3[0]._4_4_,1);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result2,&local_178,0x1bb,1,2,pCVar3,"result[1]",result3,"1");
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x1bc;
  file_01.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
             msg_01);
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result2[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1a0 = "";
  pCVar3 = result + 2;
  result3[0] = CONCAT44(result3[0]._4_4_,1);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result2,&local_1a8,0x1bc,1,2,pCVar3,"result[2]",result3,"1");
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x1bd;
  file_02.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c8,
             msg_02);
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result2[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1d0 = "";
  pCVar3 = result + 3;
  result3[0] = CONCAT44(result3[0]._4_4_,2);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result2,&local_1d8,0x1bd,1,2,pCVar3,"result[3]",result3,"2");
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x1be;
  file_03.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
             msg_03);
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result2[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_200 = "";
  pCVar3 = result + 4;
  result3[0] = CONCAT44(result3[0]._4_4_,2);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result2,&local_208,0x1be,1,2,pCVar3,"result[4]",result3,"2");
  result2[2] = 0;
  result2[3] = 0;
  result2[4] = 0;
  result2[0] = 0;
  result2[1] = 0;
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  result3[0] = CONCAT44(result3[0]._4_4_,1);
  result4[0] = CONCAT44(result4[0]._4_4_,9);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,2);
  result4[0] = CONCAT44(result4[0]._4_4_,0x10);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,4);
  result4[0] = CONCAT44(result4[0]._4_4_,0x32);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,5);
  result4[0] = CONCAT44(result4[0]._4_4_,10);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,9);
  result4[0] = CONCAT44(result4[0]._4_4_,0xf);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  CalculatePercentilesByWeight(result2,&feerates,100);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x1cd;
  file_04.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_228,
             msg_04);
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result3[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_230 = "";
  result4[0] = CONCAT44(result4[0]._4_4_,2);
  pvVar2 = (iterator)0x2;
  pCVar3 = result2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result3,&local_238,0x1cd,1,2,pCVar3,"result2[0]",result4,"2");
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pCVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x1ce;
  file_05.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_258,
             msg_05);
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result3[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_260 = "";
  pCVar3 = result2 + 1;
  result4[0] = CONCAT44(result4[0]._4_4_,2);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result3,&local_268,0x1ce,1,2,pCVar3,"result2[1]",result4,"2");
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pCVar3;
  msg_06.m_begin = pvVar2;
  file_06.m_end = (iterator)0x1cf;
  file_06.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288,
             msg_06);
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result3[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_290 = "";
  pCVar3 = result2 + 2;
  result4[0] = CONCAT44(result4[0]._4_4_,4);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result3,&local_298,0x1cf,1,2,pCVar3,"result2[2]",result4,"4");
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pCVar3;
  msg_07.m_begin = pvVar2;
  file_07.m_end = (iterator)0x1d0;
  file_07.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2b8,
             msg_07);
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result3[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2c0 = "";
  pCVar3 = result2 + 3;
  result4[0] = CONCAT44(result4[0]._4_4_,4);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result3,&local_2c8,0x1d0,1,2,pCVar3,"result2[3]",result4,"4");
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pCVar3;
  msg_08.m_begin = pvVar2;
  file_08.m_end = (iterator)0x1d1;
  file_08.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2e8,
             msg_08);
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result3[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2f0 = "";
  pCVar3 = result2 + 4;
  result4[0] = CONCAT44(result4[0]._4_4_,9);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result3,&local_2f8,0x1d1,1,2,pCVar3,"result2[4]",result4,"9");
  result3[2] = 0;
  result3[3] = 0;
  result3[4] = 0;
  result3[0] = 0;
  result3[1] = 0;
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  result4[0] = CONCAT44(result4[0]._4_4_,1);
  local_430._0_4_ = 9;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_430);
  result4[0] = CONCAT44(result4[0]._4_4_,2);
  local_430._0_4_ = 0xb;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_430);
  result4[0] = CONCAT44(result4[0]._4_4_,2);
  local_430._0_4_ = 5;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_430);
  result4[0] = CONCAT44(result4[0]._4_4_,4);
  local_430._0_4_ = 0x32;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_430);
  result4[0] = CONCAT44(result4[0]._4_4_,5);
  local_430._0_4_ = 10;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_430);
  result4[0] = CONCAT44(result4[0]._4_4_,9);
  local_430._0_4_ = 0xf;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_430);
  CalculatePercentilesByWeight(result3,&feerates,100);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pCVar3;
  msg_09.m_begin = pvVar2;
  file_09.m_end = (iterator)0x1e1;
  file_09.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_318,
             msg_09);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_320 = "";
  local_430._0_4_ = 2;
  pvVar2 = (iterator)0x2;
  pCVar3 = result3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result4,&local_328,0x1e1,1,2,pCVar3,"result3[0]",&local_430,"2");
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pCVar3;
  msg_10.m_begin = pvVar2;
  file_10.m_end = (iterator)0x1e2;
  file_10.m_begin = (iterator)&local_338;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_348,
             msg_10);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_350 = "";
  pCVar3 = result3 + 1;
  local_430._0_4_ = 2;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result4,&local_358,0x1e2,1,2,pCVar3,"result3[1]",&local_430,"2");
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pCVar3;
  msg_11.m_begin = pvVar2;
  file_11.m_end = (iterator)0x1e3;
  file_11.m_begin = (iterator)&local_368;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_378,
             msg_11);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_380 = "";
  pCVar3 = result3 + 2;
  local_430._0_4_ = 4;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result4,&local_388,0x1e3,1,2,pCVar3,"result3[2]",&local_430,"4");
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pCVar3;
  msg_12.m_begin = pvVar2;
  file_12.m_end = (iterator)0x1e4;
  file_12.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3a8,
             msg_12);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3b0 = "";
  pCVar3 = result3 + 3;
  local_430._0_4_ = 4;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result4,&local_3b8,0x1e4,1,2,pCVar3,"result3[3]",&local_430,"4");
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)pCVar3;
  msg_13.m_begin = pvVar2;
  file_13.m_end = (iterator)0x1e5;
  file_13.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3d8,
             msg_13);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01139f30;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3e0 = "";
  pCVar3 = result3 + 4;
  local_430._0_4_ = 9;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (result4,&local_3e8,0x1e5,1,2,pCVar3,"result3[4]",&local_430,"9");
  result4[2] = 0;
  result4[3] = 0;
  result4[4] = 0;
  result4[0] = 0;
  result4[1] = 0;
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_430._0_4_ = 1;
  local_3ec = 100;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_430,&local_3ec);
  local_430._0_4_ = 2;
  local_3ec = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_430,&local_3ec);
  local_430._0_4_ = 3;
  local_3ec = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_430,&local_3ec);
  local_430._0_4_ = 3;
  local_3ec = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_430,&local_3ec);
  local_430 = (undefined **)CONCAT44(local_430._4_4_,999999);
  local_3ec = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_430,&local_3ec);
  CalculatePercentilesByWeight(result4,&feerates,0x68);
  for (lVar4 = 0; lVar4 != 0x28; lVar4 = lVar4 + 8) {
    local_400 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
    ;
    local_3f8 = "";
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = (iterator)pCVar3;
    msg_14.m_begin = pvVar2;
    file_14.m_end = (iterator)0x1f5;
    file_14.m_begin = (iterator)&local_400;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_410,
               msg_14);
    local_428 = 0;
    local_430 = &PTR__lazy_ostream_01139f30;
    local_420 = boost::unit_test::lazy_ostream::inst;
    local_418 = "";
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
    ;
    local_438 = "";
    pCVar3 = (CAmount *)((long)result4 + lVar4);
    local_3ec = 1;
    pvVar2 = (iterator)0x2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_430,&local_440,0x1f5,1,2,pCVar3,"result4[i]",&local_3ec,"1");
  }
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&feerates.
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_getblockstats_calculate_percentiles_by_weight)
{
    int64_t total_weight = 200;
    std::vector<std::pair<CAmount, int64_t>> feerates;
    CAmount result[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };

    for (int64_t i = 0; i < 100; i++) {
        feerates.emplace_back(1 ,1);
    }

    for (int64_t i = 0; i < 100; i++) {
        feerates.emplace_back(2 ,1);
    }

    CalculatePercentilesByWeight(result, feerates, total_weight);
    BOOST_CHECK_EQUAL(result[0], 1);
    BOOST_CHECK_EQUAL(result[1], 1);
    BOOST_CHECK_EQUAL(result[2], 1);
    BOOST_CHECK_EQUAL(result[3], 2);
    BOOST_CHECK_EQUAL(result[4], 2);

    // Test with more pairs, and two pairs overlapping 2 percentiles.
    total_weight = 100;
    CAmount result2[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 9);
    feerates.emplace_back(2 , 16); //10th + 25th percentile
    feerates.emplace_back(4 ,50); //50th + 75th percentile
    feerates.emplace_back(5 ,10);
    feerates.emplace_back(9 ,15);  // 90th percentile

    CalculatePercentilesByWeight(result2, feerates, total_weight);

    BOOST_CHECK_EQUAL(result2[0], 2);
    BOOST_CHECK_EQUAL(result2[1], 2);
    BOOST_CHECK_EQUAL(result2[2], 4);
    BOOST_CHECK_EQUAL(result2[3], 4);
    BOOST_CHECK_EQUAL(result2[4], 9);

    // Same test as above, but one of the percentile-overlapping pairs is split in 2.
    total_weight = 100;
    CAmount result3[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 9);
    feerates.emplace_back(2 , 11); // 10th percentile
    feerates.emplace_back(2 , 5); // 25th percentile
    feerates.emplace_back(4 ,50); //50th + 75th percentile
    feerates.emplace_back(5 ,10);
    feerates.emplace_back(9 ,15); // 90th percentile

    CalculatePercentilesByWeight(result3, feerates, total_weight);

    BOOST_CHECK_EQUAL(result3[0], 2);
    BOOST_CHECK_EQUAL(result3[1], 2);
    BOOST_CHECK_EQUAL(result3[2], 4);
    BOOST_CHECK_EQUAL(result3[3], 4);
    BOOST_CHECK_EQUAL(result3[4], 9);

    // Test with one transaction spanning all percentiles.
    total_weight = 104;
    CAmount result4[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 100);
    feerates.emplace_back(2, 1);
    feerates.emplace_back(3, 1);
    feerates.emplace_back(3, 1);
    feerates.emplace_back(999999, 1);

    CalculatePercentilesByWeight(result4, feerates, total_weight);

    for (int64_t i = 0; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        BOOST_CHECK_EQUAL(result4[i], 1);
    }
}